

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseGoogleTestFlag(char *arg)

{
  bool bVar1;
  bool *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  Int32 *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  string *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  bool bVar2;
  
  bVar1 = ParseBoolFlag(in_stack_00000008,unaff_retaddr,in_RDI);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = ParseBoolFlag(in_stack_00000008,unaff_retaddr,in_RDI);
    bVar2 = true;
    if (!bVar1) {
      bVar1 = ParseBoolFlag(in_stack_00000008,unaff_retaddr,in_RDI);
      bVar2 = true;
      if (!bVar1) {
        bVar1 = ParseStringFlag(in_RDI,(char *)CONCAT17(1,in_stack_fffffffffffffff0),
                                in_stack_ffffffffffffffe8);
        bVar2 = true;
        if (!bVar1) {
          bVar1 = ParseStringFlag(in_RDI,(char *)CONCAT17(1,in_stack_fffffffffffffff0),
                                  in_stack_ffffffffffffffe8);
          bVar2 = true;
          if (!bVar1) {
            bVar1 = ParseBoolFlag(in_stack_00000008,unaff_retaddr,in_RDI);
            bVar2 = true;
            if (!bVar1) {
              bVar1 = ParseStringFlag(in_RDI,(char *)CONCAT17(1,in_stack_fffffffffffffff0),
                                      in_stack_ffffffffffffffe8);
              bVar2 = true;
              if (!bVar1) {
                bVar1 = ParseStringFlag(in_RDI,(char *)CONCAT17(1,in_stack_fffffffffffffff0),
                                        in_stack_ffffffffffffffe8);
                bVar2 = true;
                if (!bVar1) {
                  bVar1 = ParseBoolFlag(in_stack_00000008,unaff_retaddr,in_RDI);
                  bVar2 = true;
                  if (!bVar1) {
                    bVar1 = ParseStringFlag(in_RDI,(char *)CONCAT17(1,in_stack_fffffffffffffff0),
                                            in_stack_ffffffffffffffe8);
                    bVar2 = true;
                    if (!bVar1) {
                      bVar1 = ParseBoolFlag(in_stack_00000008,unaff_retaddr,in_RDI);
                      bVar2 = true;
                      if (!bVar1) {
                        bVar1 = ParseInt32Flag(in_stack_00000038,in_stack_00000030,in_stack_00000028
                                              );
                        bVar2 = true;
                        if (!bVar1) {
                          bVar1 = ParseInt32Flag(in_stack_00000038,in_stack_00000030,
                                                 in_stack_00000028);
                          bVar2 = true;
                          if (!bVar1) {
                            bVar1 = ParseBoolFlag(in_stack_00000008,unaff_retaddr,in_RDI);
                            bVar2 = true;
                            if (!bVar1) {
                              bVar1 = ParseInt32Flag(in_stack_00000038,in_stack_00000030,
                                                     in_stack_00000028);
                              bVar2 = true;
                              if (!bVar1) {
                                bVar1 = ParseStringFlag(in_RDI,(char *)CONCAT17(1,
                                                  in_stack_fffffffffffffff0),
                                                  in_stack_ffffffffffffffe8);
                                bVar2 = true;
                                if (!bVar1) {
                                  bVar2 = ParseBoolFlag(in_stack_00000008,unaff_retaddr,in_RDI);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool ParseGoogleTestFlag(const char* const arg) {
  return ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                       &GTEST_FLAG(also_run_disabled_tests)) ||
      ParseBoolFlag(arg, kBreakOnFailureFlag,
                    &GTEST_FLAG(break_on_failure)) ||
      ParseBoolFlag(arg, kCatchExceptionsFlag,
                    &GTEST_FLAG(catch_exceptions)) ||
      ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
      ParseStringFlag(arg, kDeathTestStyleFlag,
                      &GTEST_FLAG(death_test_style)) ||
      ParseBoolFlag(arg, kDeathTestUseFork,
                    &GTEST_FLAG(death_test_use_fork)) ||
      ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
      ParseStringFlag(arg, kInternalRunDeathTestFlag,
                      &GTEST_FLAG(internal_run_death_test)) ||
      ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
      ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
      ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
      ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
      ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
      ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
      ParseInt32Flag(arg, kStackTraceDepthFlag,
                     &GTEST_FLAG(stack_trace_depth)) ||
      ParseStringFlag(arg, kStreamResultToFlag,
                      &GTEST_FLAG(stream_result_to)) ||
      ParseBoolFlag(arg, kThrowOnFailureFlag,
                    &GTEST_FLAG(throw_on_failure));
}